

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall choc::value::Value::Value(Value *this,Type *t,void *source,size_t size)

{
  pointer puVar1;
  allocator_type local_21;
  
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,(uchar *)source,
             (uchar *)(size + (long)source),&local_21);
  (this->dictionary).super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__SimpleStringDictionary_002f65c0;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (this->packedData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Type::Type(&(this->value).type,t);
  (this->value).data = puVar1;
  (this->value).stringDictionary = &(this->dictionary).super_StringDictionary;
  return;
}

Assistant:

inline Value::Value (const Type& t, const void* source, size_t size)
   : packedData (static_cast<const uint8_t*> (source), static_cast<const uint8_t*> (source) + size),
     value (t, packedData.data(), std::addressof (dictionary))
{
}